

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  SyntaxFactory *this_00;
  bool bVar1;
  SourceLocation SVar2;
  ClockingSkewSyntax *inputSkew;
  ClockingSkewSyntax *outputSkew;
  ClockingDirectionSyntax *direction;
  DefaultSkewItemSyntax *pDVar3;
  MemberSyntax *pMVar4;
  AttributeSpecSyntax *pAVar5;
  ClockingItemSyntax *pCVar6;
  uint uVar7;
  Info *pIVar8;
  Info *extraout_RDX;
  Info *pIVar9;
  TokenKind TVar10;
  ulong uVar11;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *attributes;
  TokenKind kind;
  Token TVar12;
  string_view sVar13;
  Token TVar14;
  Token local_170;
  Token local_160;
  Token local_150;
  Token semi;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  Token local_f0;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  
  Token::Token(&local_160);
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  uVar7 = TVar12.kind - 0xc1;
  if ((0x26 < uVar7) || ((0x4000000003U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
    if (TVar12.kind != DefaultKeyword) {
      pMVar4 = parseSingleMember(this,ClockingItem);
      return pMVar4;
    }
    local_160 = ParserBase::consume(&this->super_ParserBase);
  }
  Token::Token(&local_170);
  Token::Token(&local_150);
  bVar1 = ParserBase::peek(&this->super_ParserBase,InOutKeyword);
  if (bVar1) {
    local_170 = ParserBase::consume(&this->super_ParserBase);
    if (local_160.info != (Info *)0x0) {
      SVar2 = Token::location(&local_170);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x620005,SVar2);
    }
    outputSkew = (ClockingSkewSyntax *)0x0;
    inputSkew = (ClockingSkewSyntax *)0x0;
  }
  else {
    bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword);
    if (bVar1) {
      local_170 = ParserBase::consume(&this->super_ParserBase);
      inputSkew = parseClockingSkew(this);
      if ((inputSkew == (ClockingSkewSyntax *)0x0) && (local_160.info != (Info *)0x0)) {
        SVar2 = Token::location(&local_170);
        sVar13 = Token::rawText(&local_170);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                            (SourceLocation)((long)SVar2 + sVar13._M_len * 0x10000000));
        goto LAB_00366f3e;
      }
    }
    else {
LAB_00366f3e:
      inputSkew = (ClockingSkewSyntax *)0x0;
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
    if (bVar1) {
      local_150 = ParserBase::consume(&this->super_ParserBase);
      outputSkew = parseClockingSkew(this);
      if ((outputSkew == (ClockingSkewSyntax *)0x0) && (local_160.info != (Info *)0x0)) {
        SVar2 = Token::location(&local_150);
        sVar13 = Token::rawText(&local_150);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                            (SourceLocation)((long)SVar2 + sVar13._M_len * 0x10000000));
        goto LAB_00366fab;
      }
    }
    else {
LAB_00366fab:
      outputSkew = (ClockingSkewSyntax *)0x0;
    }
    if (((local_160.info != (Info *)0x0) && (local_170.info == (Info *)0x0)) &&
       (local_150.info == (Info *)0x0)) {
      SVar2 = Token::location(&local_160);
      sVar13 = Token::valueText(&local_160);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x330005,
                          (SourceLocation)((long)SVar2 + sVar13._M_len * 0x10000000));
    }
  }
  this_00 = &this->factory;
  direction = slang::syntax::SyntaxFactory::clockingDirection
                        (this_00,local_170,inputSkew,local_150,outputSkew);
  TVar12 = local_160;
  if (local_160.info != (Info *)0x0) {
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len =
         CONCAT44(decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._4_4_,1);
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
    decls.stackBase[0] = '\0';
    decls.stackBase[1] = '\0';
    decls.stackBase[2] = '\0';
    decls.stackBase[3] = '\0';
    decls.stackBase[4] = '\0';
    decls.stackBase[5] = '\0';
    decls.stackBase[6] = '\0';
    decls.stackBase[7] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[8] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[9] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[10] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xb] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xc] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xd] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xe] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xf] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x10] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x11] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x12] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x13] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x14] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x15] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x16] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x17] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)&PTR_getChild_005968d0;
    local_f0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar3 = slang::syntax::SyntaxFactory::defaultSkewItem
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&decls,TVar12,
                        direction,local_f0);
    return &pDVar3->super_MemberSyntax;
  }
  Token::Token(&semi);
  decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  current = TVar12;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar12.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar2 = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x410005,SVar2);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(TVar12.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar12,Semicolon,&semi,(DiagCode)0x410005);
      pIVar9 = extraout_RDX;
      goto LAB_0036725b;
    }
    do {
      do {
        pIVar9 = TVar12.info;
        pAVar5 = parseAttributeSpec(this);
        local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar5;
        local_118 = CONCAT71(local_118._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_128._M_first);
        TVar14 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar14.kind);
        if (TVar14.kind != Comma || bVar1) goto LAB_00367246;
        local_128._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_118 = local_118 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_128._M_first);
        TVar14 = ParserBase::peek(&this->super_ParserBase);
        pIVar8 = TVar14.info;
        kind = TVar14.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_00367246;
        }
        TVar10 = TVar12.kind;
        uVar11 = TVar14._0_8_ & 0xffffffff;
        TVar12.info = pIVar8;
        TVar12.kind = (short)uVar11;
        TVar12._2_1_ = (char)(uVar11 >> 0x10);
        TVar12.numFlags.raw = (char)(uVar11 >> 0x18);
        TVar12.rawLen = (int)(uVar11 >> 0x20);
      } while (pIVar9 != pIVar8 || TVar10 != kind);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                        (&this->super_ParserBase,(DiagCode)0x410005,true);
      uVar11 = TVar14._0_8_ & 0xffffffff;
      TVar12.kind = (short)uVar11;
      TVar12._2_1_ = (char)(uVar11 >> 0x10);
      TVar12.numFlags.raw = (char)(uVar11 >> 0x18);
      TVar12.rawLen = (int)(uVar11 >> 0x20);
    } while (bVar1);
  }
LAB_00367246:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar9 = semi.info;
LAB_0036725b:
  local_128._8_4_ = 1;
  local_118 = 0;
  uStack_110 = 0;
  local_f8 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005968d0;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar9);
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_005996c0;
  attributes = &local_128;
  pCVar6 = slang::syntax::SyntaxFactory::clockingItem
                     (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              &attributes->_M_first,direction,
                      (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)&current,semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&attributes->_M_first);
  return &pCVar6->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}